

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProc.h
# Opt level: O0

void __thiscall ImageProc::smoothPerimeter(ImageProc *this,float smoothParam)

{
  size_type sVar1;
  reference pvVar2;
  float fVar3;
  float local_bc;
  value_type local_b0;
  Point_ local_a8 [8];
  Point2d first;
  Point_<float> local_90;
  Point_<float> local_88;
  Point_<float> local_80;
  undefined1 local_78 [8];
  Point2f pnt;
  int j;
  Point2f p3;
  Point2f p2;
  Point2f p1;
  Point_<float> local_48;
  Point2f p0;
  int i;
  float length;
  double stepsize;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> splinePoints;
  float smoothParam_local;
  ImageProc *this_local;
  
  if ((smoothParam < 1.0) && (0.0 < smoothParam)) {
    splinePoints.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = smoothParam;
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&stepsize);
    fVar3 = 1.0 / splinePoints.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar1 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                      (&this->BoundaryPoints);
    local_bc = (float)sVar1;
    p0.y = local_bc *
           splinePoints.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    for (p0.x = 0.0; (float)(int)p0.x < p0.y - 3.0; p0.x = (float)((int)p0.x + 1)) {
      pvVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                         (&this->BoundaryPoints,
                          (long)(int)((float)(int)p0.x /
                                     splinePoints.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
      cv::Point_<float>::Point_(&local_48,pvVar2);
      pvVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                         (&this->BoundaryPoints,
                          (long)(int)((float)((int)p0.x + 1) /
                                     splinePoints.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
      cv::Point_<float>::Point_(&p2,pvVar2);
      pvVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                         (&this->BoundaryPoints,
                          (long)(int)((float)((int)p0.x + 2) /
                                     splinePoints.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
      cv::Point_<float>::Point_(&p3,pvVar2);
      pvVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                         (&this->BoundaryPoints,
                          (long)(int)((float)((int)p0.x + 3) /
                                     splinePoints.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
      cv::Point_<float>::Point_((Point_<float> *)&pnt.y,pvVar2);
      for (pnt.x = 0.0; (int)pnt.x < (int)(fVar3 * 2.0); pnt.x = (float)((int)pnt.x + 1)) {
        cv::Point_<float>::Point_(&local_80,&local_48);
        cv::Point_<float>::Point_(&local_88,&p2);
        cv::Point_<float>::Point_(&local_90,&p3);
        cv::Point_<float>::Point_((Point_<float> *)&first.y,(Point_<float> *)&pnt.y);
        pointOnCurve((ImageProc *)local_78,(Point2f *)this,&local_80,&local_88,&local_90,
                     splinePoints.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0.5 *
                     (float)(int)pnt.x);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  (&this->SmoothedBoundaryPoints,(value_type *)local_78);
      }
    }
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
              (&this->SmoothedBoundaryPoints,0);
    cv::Point_::operator_cast_to_Point_(local_a8);
    cv::Point_::operator_cast_to_Point_((Point_ *)&local_b0);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
              (&this->SmoothedBoundaryPoints,&local_b0);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::clear
              (&this->BoundaryPoints);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
              (&this->BoundaryPoints,&this->SmoothedBoundaryPoints);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&stepsize);
  }
  return;
}

Assistant:

void smoothPerimeter(float smoothParam)
	{
		// if given params is out of range return unsmoothed version of perimeter
		if (smoothParam >= 1 || smoothParam <=0)
		{
			return;
		}
			
		std::vector<cv::Point2f> splinePoints;
		double stepsize=1/smoothParam;	
		float length= BoundaryPoints.size() * smoothParam;

		for (int i = 0; i < length - 3; i++)
		{
			cv::Point2f p0= BoundaryPoints[(int)(i/ smoothParam)]; 
			cv::Point2f p1 = BoundaryPoints[(int)((i+1) / smoothParam)];
			cv::Point2f p2 = BoundaryPoints[(int)((i+2) / smoothParam)];
			cv::Point2f p3 = BoundaryPoints[(int)((i+3) / smoothParam)];

			for (int j = 0; j < (int)(2*stepsize); j++)
			{
				//std::cout << j << " " ;
				cv::Point2f pnt= pointOnCurve(p0,  p1,  p2, p3, smoothParam/2*j);
				SmoothedBoundaryPoints.push_back(pnt);
			}
		}
		cv::Point2d first = SmoothedBoundaryPoints[0];
		SmoothedBoundaryPoints.push_back(first);

		BoundaryPoints.clear();		
		BoundaryPoints=SmoothedBoundaryPoints;
		
	}